

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O1

ssize_t __thiscall rtosc::ThreadLink::read(ThreadLink *this,int __fd,void *__buf,size_t __nbytes)

{
  internal_ringbuffer_t *piVar1;
  long lVar2;
  size_t __n;
  ulong uVar3;
  char *__src;
  size_t __n_00;
  char *__dest;
  ring_t r [2];
  char local_5c;
  ring_t local_58;
  char *local_48;
  ulong uStack_40;
  
  piVar1 = this->ring;
  local_58.len = (((piVar1->write).super___atomic_base<long>._M_i -
                  (&piVar1->read)[(uint)__fd].super___atomic_base<long>._M_i) + piVar1->size) %
                 piVar1->size;
  lVar2 = (&piVar1->read)[(uint)__fd].super___atomic_base<long>._M_i;
  local_48 = piVar1->buffer;
  local_58.data = local_48 + lVar2;
  uStack_40 = lVar2 + local_58.len;
  if (piVar1->size < uStack_40) {
    uStack_40 = uStack_40 % piVar1->size;
    local_58.len = local_58.len - uStack_40;
  }
  else {
    local_48 = (char *)0x0;
    uStack_40 = 0;
  }
  __n = rtosc_message_ring_length(&local_58);
  __dest = this->read_buffer;
  piVar1 = this->ring;
  lVar2 = (&piVar1->read)[__fd & 0xff].super___atomic_base<long>._M_i;
  uVar3 = (lVar2 + __n) % piVar1->size;
  if ((long)uVar3 < lVar2) {
    __n_00 = piVar1->size - lVar2;
    __n = __n - __n_00;
    memcpy(__dest,piVar1->buffer + lVar2,__n_00);
    __dest = __dest + __n_00;
    __src = piVar1->buffer;
  }
  else {
    __src = piVar1->buffer + lVar2;
  }
  memcpy(__dest,__src,__n);
  local_5c = (char)__fd;
  if (local_5c == '\0') {
    LOCK();
    (piVar1->read).super___atomic_base<long>._M_i = uVar3;
    UNLOCK();
  }
  LOCK();
  (piVar1->read_lookahead).super___atomic_base<long>._M_i = uVar3;
  UNLOCK();
  return (ssize_t)this->read_buffer;
}

Assistant:

msg_t ThreadLink::read(bool lookahead) {
    ring_t r[2];
    ring_read_vector(ring,r,lookahead);
    const size_t len =
        rtosc_message_ring_length(r);
    assert(ring_read_size(ring, lookahead) >= len);
    assert(len <= MaxMsg);
    ring_read(ring, read_buffer, len, lookahead);
    return read_buffer;
}